

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Sintatico::saltBlank(Sintatico *this)

{
  bool bVar1;
  Sintatico *this_local;
  
  while( true ) {
    bVar1 = true;
    if ((this->tok != 0x13) && (bVar1 = true, this->tok != 0x14)) {
      bVar1 = this->tok == 0x17;
    }
    if (!bVar1) break;
    avancar(this);
  }
  return;
}

Assistant:

void Sintatico::saltBlank() {
  while(tok == BARRAN || tok == WHITE || tok == TAB)
    avancar();
}